

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flv.h
# Opt level: O1

size_t flvtag_header_size(flvtag_t *tag)

{
  byte *pbVar1;
  size_t sVar2;
  byte bVar3;
  
  pbVar1 = tag->data;
  bVar3 = *pbVar1 & 0x1f;
  if (bVar3 == 9) {
    if ((pbVar1[0xb] & 0xf) != 7) {
      return (ulong)((pbVar1[0xb] & 0xf) == 7) * 4 + 0xc;
    }
    sVar2 = (ulong)((pbVar1[0xb] & 0xf0) != 0x50) * 3 + 0xd;
  }
  else {
    sVar2 = 0xb;
    if (bVar3 == 8) {
      return (ulong)(*pbVar1 == 0xa8) | 0xc;
    }
  }
  return sVar2;
}

Assistant:

static inline flvtag_type_t flvtag_type(flvtag_t* tag) { return (flvtag_type_t)tag->data[0] & 0x1F; }